

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeSetRootDirection(void *arkode_mem,int *rootdir)

{
  long lVar1;
  long lVar2;
  int line;
  long lVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar4 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x511;
  }
  else {
    lVar1 = *(long *)((long)arkode_mem + 0x3a0);
    if (lVar1 == 0) {
      msgfmt = "arkode_mem = NULL illegal.";
      iVar4 = -0x15;
      error_code = -0x15;
      line = 0x518;
    }
    else {
      if (*(int *)(lVar1 + 8) != 0) {
        if (0 < *(int *)(lVar1 + 8)) {
          lVar2 = *(long *)(lVar1 + 0x18);
          lVar3 = 0;
          do {
            *(int *)(lVar2 + lVar3 * 4) = rootdir[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 < *(int *)(lVar1 + 8));
          return 0;
        }
        return 0;
      }
      msgfmt = "Rootfinding was not initialized.";
      iVar4 = -0x16;
      error_code = -0x16;
      line = 0x520;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetRootDirection",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return iVar4;
}

Assistant:

int ARKodeSetRootDirection(void* arkode_mem, int* rootdir)
{
  ARKodeMem ark_mem;
  ARKodeRootMem ark_root_mem;
  int i;

  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  if (ark_mem->root_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_root_mem = (ARKodeRootMem)ark_mem->root_mem;

  if (ark_root_mem->nrtfn == 0)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_ROOT);
    return (ARK_ILL_INPUT);
  }
  for (i = 0; i < ark_root_mem->nrtfn; i++)
  {
    ark_root_mem->rootdir[i] = rootdir[i];
  }
  return (ARK_SUCCESS);
}